

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                   (GeneratorOptions *options,FieldDescriptor *field,bool is_setter_argument,
                   bool force_present,bool singular_if_not_packed,BytesMode bytes_mode,
                   bool force_singular)

{
  bool bVar1;
  byte in_CL;
  string *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int in_stack_00000008;
  byte in_stack_00000010;
  bool is_null_or_undefined;
  string *jstype;
  GeneratorOptions *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee5;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  Type in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  string local_f8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  BytesMode in_stack_ffffffffffffff2c;
  FieldDescriptor *in_stack_ffffffffffffff30;
  GeneratorOptions *in_stack_ffffffffffffff38;
  string local_b8 [39];
  byte local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [51];
  undefined1 local_1d;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = (byte)in_R8D & 1;
  local_1b = (byte)in_R9D & 1;
  local_1c = in_stack_00000010 & 1;
  local_1d = 0;
  JSTypeName_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  if ((((local_1c & 1) == 0) &&
      (in_stack_fffffffffffffeef = FieldDescriptor::is_repeated((FieldDescriptor *)0x46e1d0),
      (bool)in_stack_fffffffffffffeef)) &&
     ((in_stack_fffffffffffffeee =
            FieldDescriptor::is_packed
                      ((FieldDescriptor *)
                       CONCAT17(in_stack_fffffffffffffeef,
                                CONCAT16(in_stack_fffffffffffffeee,
                                         CONCAT24(in_stack_fffffffffffffeec,
                                                  in_stack_fffffffffffffee8)))),
      (bool)in_stack_fffffffffffffeee || ((local_1b & 1) == 0)))) {
    in_stack_fffffffffffffee8 = FieldDescriptor::type((FieldDescriptor *)CONCAT44(in_R8D,in_R9D));
    if ((in_stack_fffffffffffffee8 == TYPE_BYTES) && (in_stack_00000008 == 0)) {
      std::__cxx11::string::operator=((string *)in_RDI,"(Array<!Uint8Array>|Array<string>)");
    }
    else {
      in_stack_fffffffffffffee7 =
           anon_unknown_0::IsPrimitive
                     ((string *)
                      CONCAT17(in_stack_fffffffffffffee7,
                               CONCAT16(in_stack_fffffffffffffee6,
                                        CONCAT15(in_stack_fffffffffffffee5,
                                                 CONCAT14(in_stack_fffffffffffffee4,
                                                          in_stack_fffffffffffffee0)))));
      if (!(bool)in_stack_fffffffffffffee7) {
        std::operator+((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       in_stack_ffffffffffffff20);
        std::__cxx11::string::operator=((string *)in_RDI,local_50);
        std::__cxx11::string::~string(local_50);
      }
      std::operator+((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffeef,
                              CONCAT16(in_stack_fffffffffffffeee,
                                       CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                                      )),
                     (char *)CONCAT17(in_stack_fffffffffffffee7,
                                      CONCAT16(in_stack_fffffffffffffee6,
                                               CONCAT15(in_stack_fffffffffffffee5,
                                                        CONCAT14(in_stack_fffffffffffffee4,
                                                                 in_stack_fffffffffffffee0)))));
      std::__cxx11::string::operator=((string *)in_RDI,local_70);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
    }
  }
  local_91 = 0;
  if ((local_19 & 1) == 0) {
    if (((local_1a & 1) == 0) &&
       (in_stack_fffffffffffffee4 =
             anon_unknown_0::DeclaredReturnTypeIsNullable
                       (in_stack_fffffffffffffed8,(FieldDescriptor *)0x46e41f),
       (bool)in_stack_fffffffffffffee4)) {
      std::operator+((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff20);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)&stack0xffffffffffffff28);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
      local_91 = 1;
    }
  }
  else {
    in_stack_fffffffffffffee6 =
         anon_unknown_0::SetterAcceptsNull
                   ((GeneratorOptions *)
                    CONCAT17(in_stack_fffffffffffffeef,
                             CONCAT16(in_stack_fffffffffffffeee,
                                      CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
                            ),
                    (FieldDescriptor *)
                    CONCAT17(in_stack_fffffffffffffee7,
                             CONCAT16(in_stack_fffffffffffffee6,
                                      CONCAT15(in_stack_fffffffffffffee5,
                                               CONCAT14(in_stack_fffffffffffffee4,
                                                        in_stack_fffffffffffffee0)))));
    if ((bool)in_stack_fffffffffffffee6) {
      std::operator+((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff20);
      std::__cxx11::string::operator=((string *)in_RDI,local_b8);
      std::__cxx11::string::~string(local_b8);
      local_91 = 1;
    }
    in_stack_fffffffffffffee5 =
         anon_unknown_0::SetterAcceptsUndefined
                   (in_stack_fffffffffffffed8,(FieldDescriptor *)0x46e3d1);
    if ((bool)in_stack_fffffffffffffee5) {
      std::__cxx11::string::operator+=((string *)in_RDI,"|undefined");
      local_91 = 1;
    }
  }
  if (((local_91 & 1) == 0) &&
     (bVar1 = anon_unknown_0::IsPrimitive
                        ((string *)
                         CONCAT17(in_stack_fffffffffffffee7,
                                  CONCAT16(in_stack_fffffffffffffee6,
                                           CONCAT15(in_stack_fffffffffffffee5,
                                                    CONCAT14(in_stack_fffffffffffffee4,
                                                             in_stack_fffffffffffffee0))))), !bVar1)
     ) {
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff20);
    std::__cxx11::string::operator=((string *)in_RDI,local_f8);
    std::__cxx11::string::~string(local_f8);
  }
  return in_RDI;
}

Assistant:

std::string JSFieldTypeAnnotation(const GeneratorOptions& options,
                                  const FieldDescriptor* field,
                                  bool is_setter_argument, bool force_present,
                                  bool singular_if_not_packed,
                                  BytesMode bytes_mode = BYTES_DEFAULT,
                                  bool force_singular = false) {
  std::string jstype = JSTypeName(options, field, bytes_mode);

  if (!force_singular && field->is_repeated() &&
      (field->is_packed() || !singular_if_not_packed)) {
    if (field->type() == FieldDescriptor::TYPE_BYTES &&
        bytes_mode == BYTES_DEFAULT) {
      jstype = "(Array<!Uint8Array>|Array<string>)";
    } else {
      if (!IsPrimitive(jstype)) {
        jstype = "!" + jstype;
      }
      jstype = "Array<" + jstype + ">";
    }
  }

  bool is_null_or_undefined = false;

  if (is_setter_argument) {
    if (SetterAcceptsNull(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }

    if (SetterAcceptsUndefined(options, field)) {
      jstype += "|undefined";
      is_null_or_undefined = true;
    }
  } else if (force_present) {
    // Don't add null or undefined.
  } else {
    if (DeclaredReturnTypeIsNullable(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }
  }

  if (!is_null_or_undefined && !IsPrimitive(jstype)) {
    jstype = "!" + jstype;
  }

  return jstype;
}